

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,int64_t x)

{
  value_type_conflict2 local_20;
  value_type_conflict2 local_1f;
  value_type_conflict2 local_1e;
  value_type_conflict2 local_1d;
  value_type_conflict2 local_1c;
  value_type_conflict2 local_1b;
  value_type_conflict2 local_1a;
  value_type_conflict2 local_19;
  long local_18;
  int64_t x_local;
  BufferWithRandomAccess *this_local;
  
  local_19 = (value_type_conflict2)x;
  local_18 = x;
  x_local = (int64_t)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  local_1a = (value_type_conflict2)((ulong)local_18 >> 8);
  local_18 = local_18 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1a);
  local_1b = (value_type_conflict2)((ulong)local_18 >> 8);
  local_18 = local_18 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1b);
  local_1c = (value_type_conflict2)((ulong)local_18 >> 8);
  local_18 = local_18 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1c);
  local_1d = (value_type_conflict2)((ulong)local_18 >> 8);
  local_18 = local_18 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1d);
  local_1e = (value_type_conflict2)((ulong)local_18 >> 8);
  local_18 = local_18 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1e);
  local_1f = (value_type_conflict2)((ulong)local_18 >> 8);
  local_18 = local_18 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_1f);
  local_20 = (value_type_conflict2)((ulong)local_18 >> 8);
  local_18 = local_18 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_20);
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(int64_t x) {
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    return *this;
  }